

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O1

void mpp_put_align(BitputCtx_t *bp,RK_S32 align_bits,int flag)

{
  int iVar1;
  uint lbits;
  ulong uVar2;
  RK_U64 invalue;
  RK_U64 invalue_00;
  
  iVar1 = 0;
  if (0x3f < align_bits) {
    iVar1 = (((uint)align_bits >> 6 & 0x3f) - 1 & bp->index) * -0x40;
  }
  uVar2 = (ulong)(uint)((iVar1 + align_bits) - (int)((long)(ulong)bp->bitpos % (long)align_bits)) %
          (ulong)(uint)align_bits;
  if ((int)uVar2 != 0) {
    invalue_00 = 0xff;
    if (flag == 0) {
      invalue_00 = 0;
    }
    do {
      lbits = (uint)uVar2;
      if (lbits < 8) {
        if (flag == 0) {
          invalue = 0;
        }
        else {
          invalue = 0xffffffffffffffff >> (-(char)uVar2 & 0x3fU);
        }
        mpp_put_bits(bp,invalue,lbits);
        uVar2 = 0;
      }
      else {
        mpp_put_bits(bp,invalue_00,8);
        uVar2 = (ulong)(lbits - 8);
      }
    } while ((int)uVar2 != 0);
  }
  return;
}

Assistant:

void mpp_put_align(BitputCtx_t *bp, RK_S32 align_bits, int flag)
{
    RK_U32 word_offset = 0,  len = 0;

    word_offset = (align_bits >= 64) ? ((bp->index & (((align_bits & 0xfe0) >> 6) - 1)) << 6) : 0;
    len = (align_bits - (word_offset + (bp->bitpos % align_bits))) % align_bits;
    while (len > 0) {
        if (len >= 8) {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - 8)) >> (64 - 8), 8);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - 8)) >> (64 - 8), 8);
            len -= 8;
        } else {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - len)) >> (64 - len), len);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - len)) >> (64 - len), len);
            len -= len;
        }
    }
}